

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::MatchLiteralNode::AppendLiteral
          (MatchLiteralNode *this,CharCount *litbufNext,CharCount litbufLen,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  uint uVar6;
  
  if (this->isEquivClass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x323,"(!isEquivClass)","!isEquivClass");
    if (!bVar2) goto LAB_00e9708d;
    *puVar4 = 0;
  }
  uVar5 = *litbufNext;
  uVar3 = this->length;
  uVar6 = uVar3 + uVar5;
  if ((litbufLen < uVar6) || (litbufLen < this->offset + uVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x324,"(litbufNext + length <= litbufLen && offset + length <= litbufLen)",
                       "litbufNext + length <= litbufLen && offset + length <= litbufLen");
    if (!bVar2) {
LAB_00e9708d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar5 = *litbufNext;
    uVar3 = this->length;
    uVar6 = uVar3 + uVar5;
  }
  if ((uVar6 <= litbufLen) && (this->offset + uVar3 <= litbufLen)) {
    js_wmemcpy_s(litbuf + uVar5,(ulong)(litbufLen - uVar5),litbuf + this->offset,(ulong)uVar3);
    uVar6 = *litbufNext + this->length;
  }
  *litbufNext = uVar6;
  return;
}

Assistant:

void MatchLiteralNode::AppendLiteral(CharCount& litbufNext, CharCount litbufLen, __inout_ecount(litbufLen) Char* litbuf) const
    {
        // Called during parsing only, so literal always in original form
        Assert(!isEquivClass);
        Assert(litbufNext + length <= litbufLen && offset + length <= litbufLen);
#pragma prefast(suppress:26000, "The error said that offset + length >= litbufLen + 1, which is incorrect due to if statement below.")
        if (litbufNext + length <= litbufLen && offset + length <= litbufLen) // for prefast
        {
            js_wmemcpy_s(litbuf + litbufNext, litbufLen - litbufNext, litbuf + offset, length);
        }
        litbufNext += length;
    }